

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O1

void __thiscall doctest::detail::TestCase::TestCase(TestCase *this,TestCase *other)

{
  *(undefined8 *)((long)&(this->super_TestCaseData).m_file.field_0 + 0x10) = 0;
  *(undefined8 *)&(this->super_TestCaseData).m_line = 0;
  *(undefined8 *)&(this->super_TestCaseData).m_expected_failures = 0;
  (this->super_TestCaseData).m_timeout = 0.0;
  (this->super_TestCaseData).m_description = (char *)0x0;
  (this->super_TestCaseData).m_skip = false;
  (this->super_TestCaseData).m_no_breaks = false;
  (this->super_TestCaseData).m_no_output = false;
  (this->super_TestCaseData).m_may_fail = false;
  (this->super_TestCaseData).m_should_fail = false;
  *(undefined3 *)&(this->super_TestCaseData).field_0x3d = 0;
  (this->super_TestCaseData).m_name = (char *)0x0;
  (this->super_TestCaseData).m_test_suite = (char *)0x0;
  (this->super_TestCaseData).m_file.field_0.data.ptr = (char *)0x0;
  *(undefined8 *)((long)&(this->super_TestCaseData).m_file.field_0 + 8) = 0;
  (this->super_TestCaseData).m_file.field_0.buf[0x17] = '\x17';
  (this->m_type).field_0.buf[0] = '\0';
  (this->m_type).field_0.buf[0x17] = '\x17';
  (this->m_full_name).field_0.buf[0] = '\0';
  (this->m_full_name).field_0.buf[0x17] = '\x17';
  operator=(this,other);
  return;
}

Assistant:

TestCase::TestCase(const TestCase& other)
            : TestCaseData() {
        *this = other;
    }